

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  InternalRunDeathTestFlag *pIVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  UnitTest *pUVar7;
  long *plVar8;
  undefined8 *puVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  void *__addr;
  int *piVar10;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 *extraout_RAX_02;
  undefined8 *extraout_RAX_03;
  undefined8 *extraout_RAX_04;
  undefined8 *extraout_RAX_05;
  undefined8 *extraout_RAX_06;
  undefined8 extraout_RAX_07;
  ulong *puVar11;
  __sighandler_t p_Var12;
  long *plVar13;
  string *psVar14;
  long lVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  _union_1457 extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  _union_1457 extraout_RDX_06;
  ulong uVar18;
  _Alloc_hider _Var19;
  undefined8 uVar20;
  const_iterator __position;
  size_t __len;
  string filter_flag;
  int pipe_fd [2];
  Arguments args;
  int death_test_index;
  ExecDeathTestArgs args_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  string internal_flag;
  sigaction ignore_sigprof_action;
  ulong *local_310;
  long local_308;
  ulong local_300;
  long lStack_2f8;
  string *local_2f0;
  long local_2e8;
  string local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  uint local_1f0;
  int local_1ec;
  string local_1e8;
  int local_1c4;
  string local_1c0;
  _union_1457 local_1a0;
  long local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [8];
  long *local_108;
  undefined8 local_100;
  long local_f8;
  undefined8 uStack_f0;
  string local_e8;
  _union_1457 local_c8;
  undefined1 local_c0 [8];
  ulong local_b8;
  ulong uStack_b0;
  
  pUVar7 = UnitTest::GetInstance();
  pIVar1 = (pUVar7->impl_->internal_run_death_test_flag_).ptr_;
  local_1c4 = (pUVar7->impl_->current_test_info_->result_).death_test_count_;
  if (pIVar1 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar1->write_fd_;
    return EXECUTE_TEST;
  }
  do {
    iVar4 = pipe((int *)&local_1f0);
    bVar3 = IsTrue(iVar4 != -1);
    if (!bVar3) {
      local_2f0 = &local_2e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CHECK failed: File ","")
      ;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
      local_310 = (ulong *)*puVar9;
      puVar11 = puVar9 + 2;
      if (local_310 == puVar11) {
        local_300 = *puVar11;
        lStack_2f8 = puVar9[3];
        local_310 = &local_300;
      }
      else {
        local_300 = *puVar11;
      }
      local_308 = puVar9[1];
      *puVar9 = puVar11;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_310);
      local_2e0.field_2._M_allocated_capacity = *plVar8;
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0.field_2._M_allocated_capacity == paVar16) {
        local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_2c0._8_8_ = plVar8[3];
        local_2e0.field_2._M_allocated_capacity = (size_type)&local_2c0;
      }
      else {
        local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
      }
      local_2e0.field_2._8_8_ = plVar8[1];
      *plVar8 = (long)paVar16;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      local_250._M_dataplus._M_p._0_4_ = 0x459;
      StreamableToString<int>(&local_290,(int *)&local_250);
      uVar20 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0.field_2._M_allocated_capacity != &local_2c0) {
        uVar20 = local_2c0._M_allocated_capacity;
      }
      if ((ulong)uVar20 < local_290._M_string_length + local_2e0.field_2._8_8_) {
        uVar20 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          uVar20 = local_290.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar20 < local_290._M_string_length + local_2e0.field_2._8_8_) goto LAB_0011a3bd;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_290,0,(char *)0x0,local_2e0.field_2._M_allocated_capacity)
        ;
      }
      else {
LAB_0011a3bd:
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           (local_2e0.field_2._M_local_buf,(ulong)local_290._M_dataplus._M_p);
      }
      local_2b0._M_dataplus._M_p = (pointer)*puVar9;
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p == paVar16) {
        local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = puVar9[3];
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
      }
      local_2b0._M_string_length = puVar9[1];
      *puVar9 = paVar16;
      puVar9[1] = 0;
      paVar16->_M_local_buf[0] = '\0';
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_c8.sa_handler = (__sighandler_t)*plVar8;
      p_Var12 = (__sighandler_t)(plVar8 + 2);
      if (local_c8.sa_handler == p_Var12) {
        local_b8 = *(ulong *)p_Var12;
        uStack_b0 = plVar8[3];
        local_c8.sa_handler = (__sighandler_t)&local_b8;
      }
      else {
        local_b8 = *(ulong *)p_Var12;
      }
      local_c0 = (undefined1  [8])plVar8[1];
      *plVar8 = (long)p_Var12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
      local_1a0.sa_handler = (__sighandler_t)*puVar9;
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0.sa_handler == paVar16) {
        local_190[0]._0_8_ = paVar16->_M_allocated_capacity;
        local_190[0]._8_8_ = puVar9[3];
        local_1a0.sa_handler = (__sighandler_t)local_190;
      }
      else {
        local_190[0]._0_8_ = paVar16->_M_allocated_capacity;
      }
      local_198 = puVar9[1];
      *puVar9 = paVar16;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      DeathTestAbort((string *)&local_1a0);
      puVar9 = extraout_RAX;
      local_1a0 = extraout_RDX;
      goto LAB_0011b2c8;
    }
    bVar3 = AlwaysTrue();
  } while (!bVar3);
LAB_00118f77:
  iVar4 = fcntl(local_1ec,2,0);
  bVar3 = IsTrue(iVar4 != -1);
  if (bVar3) goto code_r0x00118fa2;
  local_2f0 = &local_2e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CHECK failed: File ","");
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
  local_310 = (ulong *)*puVar9;
  puVar11 = puVar9 + 2;
  if (local_310 == puVar11) {
    local_300 = *puVar11;
    lStack_2f8 = puVar9[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar11;
  }
  local_308 = puVar9[1];
  *puVar9 = puVar11;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  local_2e0.field_2._M_allocated_capacity = *puVar9;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0.field_2._M_allocated_capacity == paVar16) {
    local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_2c0._8_8_ = puVar9[3];
    local_2e0.field_2._M_allocated_capacity = (size_type)&local_2c0;
  }
  else {
    local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
  }
  local_2e0.field_2._8_8_ = puVar9[1];
  *puVar9 = paVar16;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  local_250._M_dataplus._M_p._0_4_ = 0x45c;
  StreamableToString<int>(&local_290,(int *)&local_250);
  uVar20 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0.field_2._M_allocated_capacity != &local_2c0) {
    uVar20 = local_2c0._M_allocated_capacity;
  }
  if ((ulong)uVar20 < local_290._M_string_length + local_2e0.field_2._8_8_) {
    uVar20 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      uVar20 = local_290.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar20 < local_290._M_string_length + local_2e0.field_2._8_8_) goto LAB_0011a462;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_290,0,(char *)0x0,local_2e0.field_2._M_allocated_capacity);
  }
  else {
LAB_0011a462:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append
                       (local_2e0.field_2._M_local_buf,(ulong)local_290._M_dataplus._M_p);
  }
  local_2b0._M_dataplus._M_p = (pointer)*puVar9;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar16) {
    local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar9[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
  }
  local_2b0._M_string_length = puVar9[1];
  *puVar9 = paVar16;
  puVar9[1] = 0;
  paVar16->_M_local_buf[0] = '\0';
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
  local_c8.sa_handler = (__sighandler_t)*puVar9;
  p_Var12 = (__sighandler_t)(puVar9 + 2);
  if (local_c8.sa_handler == p_Var12) {
    local_b8 = *(ulong *)p_Var12;
    uStack_b0 = puVar9[3];
    local_c8.sa_handler = (__sighandler_t)&local_b8;
  }
  else {
    local_b8 = *(ulong *)p_Var12;
  }
  local_c0 = (undefined1  [8])puVar9[1];
  *puVar9 = p_Var12;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
  local_1a0.sa_handler = (__sighandler_t)*puVar9;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.sa_handler == paVar16) {
    local_190[0]._0_8_ = paVar16->_M_allocated_capacity;
    local_190[0]._8_8_ = puVar9[3];
    local_1a0.sa_handler = (__sighandler_t)local_190;
  }
  else {
LAB_0011b2c8:
    local_190[0]._0_8_ = paVar16->_M_allocated_capacity;
  }
  local_198 = puVar9[1];
  *puVar9 = paVar16;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  DeathTestAbort((string *)&local_1a0);
  puVar9 = extraout_RAX_00;
  local_2e0.field_2._M_allocated_capacity = (size_type)extraout_RDX_00;
  goto LAB_0011b2ff;
code_r0x00118fa2:
  bVar3 = AlwaysTrue();
  if (bVar3) goto code_r0x00118fab;
  goto LAB_00118f77;
code_r0x00119bd2:
  bVar3 = AlwaysTrue();
  if (bVar3) goto code_r0x00119bdb;
  goto LAB_00119bbb;
code_r0x00119bdb:
  lVar15 = 0;
  if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
    lVar15 = __len - 0x40;
  }
LAB_00119c05:
  bVar3 = IsTrue(((ulong)((long)__addr + lVar15) & 0x3f) == 0 && 0x40 < uVar5);
  if (bVar3) goto code_r0x00119c14;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","");
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
  local_290._M_dataplus._M_p = (pointer)*puVar9;
  puVar11 = puVar9 + 2;
  if ((ulong *)local_290._M_dataplus._M_p == puVar11) {
    local_290.field_2._M_allocated_capacity = *puVar11;
    local_290.field_2._8_8_ = puVar9[3];
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = *puVar11;
  }
  local_290._M_string_length = puVar9[1];
  *puVar9 = puVar11;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
  local_2f0 = (string *)*puVar9;
  psVar14 = (string *)(puVar9 + 2);
  if (local_2f0 == psVar14) {
    local_2e0._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
    local_2e0._M_string_length = puVar9[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
  }
  local_2e8 = puVar9[1];
  *puVar9 = psVar14;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  local_230._M_dataplus._M_p._0_4_ = 0x430;
  StreamableToString<int>(&local_270,(int *)&local_230);
  _Var19._M_p = (pointer)0xf;
  if (local_2f0 != &local_2e0) {
    _Var19._M_p = local_2e0._M_dataplus._M_p;
  }
  if (_Var19._M_p < (pointer)(local_270._M_string_length + local_2e8)) {
    uVar20 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      uVar20 = local_270.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar20 < (pointer)(local_270._M_string_length + local_2e8)) goto LAB_0011a9e7;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0);
  }
  else {
LAB_0011a9e7:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
  }
  local_310 = (ulong *)*puVar9;
  puVar11 = puVar9 + 2;
  if (local_310 == puVar11) {
    local_300 = *puVar11;
    lStack_2f8 = puVar9[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar11;
  }
  local_308 = puVar9[1];
  *puVar9 = puVar11;
  puVar9[1] = 0;
  *(undefined1 *)puVar11 = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  local_2e0.field_2._M_allocated_capacity = *puVar9;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0.field_2._M_allocated_capacity == paVar16) {
    local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_2c0._8_8_ = puVar9[3];
    local_2e0.field_2._M_allocated_capacity = (size_type)&local_2c0;
  }
  else {
    local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
  }
  local_2e0.field_2._8_8_ = puVar9[1];
  *puVar9 = paVar16;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append(local_2e0.field_2._M_local_buf);
  local_2b0._M_dataplus._M_p = (pointer)*puVar9;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar16) {
    local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar9[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
LAB_0011b5b9:
    local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
  }
  local_2b0._M_string_length = puVar9[1];
  *puVar9 = paVar16;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  DeathTestAbort(&local_2b0);
  puVar9 = extraout_RAX_03;
  local_2b0._M_dataplus._M_p = (pointer)extraout_RDX_03;
  goto LAB_0011b5e7;
code_r0x00119c14:
  bVar3 = AlwaysTrue();
  if (bVar3) goto code_r0x00119c1d;
  goto LAB_00119c05;
code_r0x00119c1d:
  psVar14 = &local_1c0;
  iVar4 = clone(ExecDeathTestChildMain,(void *)((long)__addr + lVar15),0x11,psVar14);
LAB_00119c3d:
  iVar6 = munmap(__addr,__len);
  bVar3 = IsTrue(iVar6 != -1);
  if (bVar3) goto code_r0x00119c5e;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","");
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
  local_290._M_dataplus._M_p = (pointer)*puVar9;
  puVar11 = puVar9 + 2;
  if ((ulong *)local_290._M_dataplus._M_p == puVar11) {
    local_290.field_2._M_allocated_capacity = *puVar11;
    local_290.field_2._8_8_ = puVar9[3];
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = *puVar11;
  }
  local_290._M_string_length = puVar9[1];
  *puVar9 = puVar11;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
  local_2f0 = (string *)*puVar9;
  psVar14 = (string *)(puVar9 + 2);
  if (local_2f0 == psVar14) {
    local_2e0._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
    local_2e0._M_string_length = puVar9[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
  }
  local_2e8 = puVar9[1];
  *puVar9 = psVar14;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  local_230._M_dataplus._M_p._0_4_ = 0x434;
  StreamableToString<int>(&local_270,(int *)&local_230);
  _Var19._M_p = (pointer)0xf;
  if (local_2f0 != &local_2e0) {
    _Var19._M_p = local_2e0._M_dataplus._M_p;
  }
  if (_Var19._M_p < (pointer)(local_270._M_string_length + local_2e8)) {
    uVar20 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      uVar20 = local_270.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar20 < (pointer)(local_270._M_string_length + local_2e8)) goto LAB_0011aa95;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0);
  }
  else {
LAB_0011aa95:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
  }
  local_310 = (ulong *)*puVar9;
  puVar11 = puVar9 + 2;
  if (local_310 == puVar11) {
    local_300 = *puVar11;
    lStack_2f8 = puVar9[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar11;
  }
  local_308 = puVar9[1];
  *puVar9 = puVar11;
  puVar9[1] = 0;
  *(undefined1 *)puVar11 = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  local_2e0.field_2._M_allocated_capacity = *puVar9;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0.field_2._M_allocated_capacity == paVar16) {
    local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_2c0._8_8_ = puVar9[3];
    local_2e0.field_2._M_allocated_capacity = (size_type)&local_2c0;
  }
  else {
    local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
  }
  local_2e0.field_2._8_8_ = puVar9[1];
  *puVar9 = paVar16;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append(local_2e0.field_2._M_local_buf);
  local_2b0._M_dataplus._M_p = (pointer)*puVar9;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar16) {
    local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar9[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
LAB_0011b5e7:
    local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
  }
  local_2b0._M_string_length = puVar9[1];
  *puVar9 = paVar16;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  DeathTestAbort(&local_2b0);
  puVar9 = extraout_RAX_04;
  local_2b0._M_dataplus._M_p = (pointer)extraout_RDX_04;
  goto LAB_0011b615;
code_r0x00119c5e:
  bVar3 = AlwaysTrue();
  if (bVar3) goto LAB_00119c67;
  goto LAB_00119c3d;
code_r0x00118fab:
  local_2f0 = &local_2e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"--","");
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2f0);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_300 = *puVar11;
    lStack_2f8 = plVar8[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar11;
    local_310 = (ulong *)*plVar8;
  }
  local_308 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_310);
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar16) {
    local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_2c0._8_8_ = plVar8[3];
    local_2e0.field_2._M_allocated_capacity = (size_type)&local_2c0;
  }
  else {
    local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_2e0.field_2._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar8;
  }
  local_2e0.field_2._8_8_ = plVar8[1];
  *plVar8 = (long)paVar16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append(local_2e0.field_2._M_local_buf);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar16) {
    local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = plVar8[3];
  }
  else {
    local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_2b0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_2b0._M_string_length = plVar8[1];
  *plVar8 = (long)paVar16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  local_c8.sa_handler = (__sighandler_t)&local_b8;
  p_Var12 = (__sighandler_t)(plVar8 + 2);
  if ((__sighandler_t)*plVar8 == p_Var12) {
    local_b8 = *(ulong *)p_Var12;
    uStack_b0 = plVar8[3];
  }
  else {
    local_b8 = *(ulong *)p_Var12;
    local_c8.sa_handler = (__sighandler_t)*plVar8;
  }
  local_c0 = (undefined1  [8])plVar8[1];
  *plVar8 = (long)p_Var12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_1a0.sa_handler = (__sighandler_t)local_190;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar16) {
    local_190[0]._0_8_ = paVar16->_M_allocated_capacity;
    local_190[0]._8_8_ = plVar8[3];
  }
  else {
    local_190[0]._0_8_ = paVar16->_M_allocated_capacity;
    local_1a0.sa_handler = (__sighandler_t)*plVar8;
  }
  local_198 = plVar8[1];
  *plVar8 = (long)paVar16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  local_210 = &local_200;
  plVar13 = plVar8 + 2;
  if ((long *)*plVar8 == plVar13) {
    local_200 = *plVar13;
    lStack_1f8 = plVar8[3];
  }
  else {
    local_200 = *plVar13;
    local_210 = (long *)*plVar8;
  }
  local_208 = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.sa_handler != local_190) {
    operator_delete(local_1a0.sa_handler,local_190[0]._M_allocated_capacity + 1);
  }
  if (local_c8.sa_handler != (__sighandler_t)&local_b8) {
    operator_delete(local_c8.sa_handler,local_b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0.field_2._M_allocated_capacity != &local_2c0) {
    operator_delete((void *)local_2e0.field_2._M_allocated_capacity,
                    local_2c0._M_allocated_capacity + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300 + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,(ulong)(local_2e0._M_dataplus._M_p + 1));
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"--","");
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_230);
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  plVar13 = plVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar13) {
    local_270.field_2._M_allocated_capacity = *plVar13;
    local_270.field_2._8_8_ = plVar8[3];
  }
  else {
    local_270.field_2._M_allocated_capacity = *plVar13;
    local_270._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_270._M_string_length = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_270);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_250.field_2._M_allocated_capacity = *puVar11;
    local_250.field_2._8_8_ = plVar8[3];
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  }
  else {
    local_250.field_2._M_allocated_capacity = *puVar11;
    local_250._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_250._M_string_length = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_250);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_290.field_2._M_allocated_capacity = *puVar11;
    local_290.field_2._8_8_ = plVar8[3];
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = *puVar11;
    local_290._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_290._M_string_length = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
  psVar14 = (string *)(puVar9 + 2);
  if ((string *)*puVar9 == psVar14) {
    local_2e0._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
    local_2e0._M_string_length = puVar9[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
    local_2f0 = (string *)*puVar9;
  }
  local_2e8 = puVar9[1];
  *puVar9 = psVar14;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2f0);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_300 = *puVar11;
    lStack_2f8 = plVar8[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar11;
    local_310 = (ulong *)*plVar8;
  }
  local_308 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  StreamableToString<int>(&local_1e8,&this->line_);
  uVar18 = 0xf;
  if (local_310 != &local_300) {
    uVar18 = local_300;
  }
  if (uVar18 < local_1e8._M_string_length + local_308) {
    uVar20 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      uVar20 = local_1e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar20 < local_1e8._M_string_length + local_308) goto LAB_001194e6;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_310);
  }
  else {
LAB_001194e6:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_1e8._M_dataplus._M_p);
  }
  local_2e0.field_2._M_allocated_capacity = (size_type)&local_2c0;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 == paVar16) {
    local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_2c0._8_8_ = puVar9[3];
  }
  else {
    local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_2e0.field_2._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar9;
  }
  local_2e0.field_2._8_8_ = puVar9[1];
  *puVar9 = paVar16;
  puVar9[1] = 0;
  paVar16->_M_local_buf[0] = '\0';
  puVar9 = (undefined8 *)std::__cxx11::string::append(local_2e0.field_2._M_local_buf);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 == paVar16) {
    local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar9[3];
  }
  else {
    local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_2b0._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_2b0._M_string_length = puVar9[1];
  *puVar9 = paVar16;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  StreamableToString<int>(&local_1c0,&local_1c4);
  uVar18 = CONCAT44(local_1c0._M_string_length._4_4_,(uint)local_1c0._M_string_length) +
           local_2b0._M_string_length;
  uVar20 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    uVar20 = local_2b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar20 < uVar18) {
    uVar20 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      uVar20 = local_1c0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar20 < uVar18) goto LAB_0011960e;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_1c0,0,(char *)0x0,(ulong)local_2b0._M_dataplus._M_p);
  }
  else {
LAB_0011960e:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_1c0._M_dataplus._M_p);
  }
  local_c8.sa_handler = (__sighandler_t)&local_b8;
  p_Var12 = (__sighandler_t)(puVar9 + 2);
  if ((__sighandler_t)*puVar9 == p_Var12) {
    local_b8 = *(ulong *)p_Var12;
    uStack_b0 = puVar9[3];
  }
  else {
    local_b8 = *(ulong *)p_Var12;
    local_c8.sa_handler = (__sighandler_t)*puVar9;
  }
  local_c0 = (undefined1  [8])puVar9[1];
  *puVar9 = p_Var12;
  puVar9[1] = 0;
  *p_Var12 = (__sighandler_t)0x0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_1a0.sa_handler = (__sighandler_t)local_190;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar16) {
    local_190[0]._0_8_ = paVar16->_M_allocated_capacity;
    local_190[0]._8_8_ = plVar8[3];
  }
  else {
    local_190[0]._0_8_ = paVar16->_M_allocated_capacity;
    local_1a0.sa_handler = (__sighandler_t)*plVar8;
  }
  local_198 = plVar8[1];
  *plVar8 = (long)paVar16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  StreamableToString<int>(&local_e8,&local_1ec);
  uVar20 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.sa_handler != local_190) {
    uVar20 = local_190[0]._M_allocated_capacity;
  }
  if ((ulong)uVar20 < local_198 + local_e8._M_string_length) {
    uVar20 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_e8._M_dataplus._M_p._4_4_,local_e8._M_dataplus._M_p._0_4_) !=
        &local_e8.field_2) {
      uVar20 = local_e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar20 < local_198 + local_e8._M_string_length) goto LAB_00119763;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_1a0);
  }
  else {
LAB_00119763:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_1a0,
                        CONCAT44(local_e8._M_dataplus._M_p._4_4_,local_e8._M_dataplus._M_p._0_4_));
  }
  local_108 = &local_f8;
  plVar8 = puVar9 + 2;
  if ((long *)*puVar9 == plVar8) {
    local_f8 = *plVar8;
    uStack_f0 = puVar9[3];
  }
  else {
    local_f8 = *plVar8;
    local_108 = (long *)*puVar9;
  }
  local_100 = puVar9[1];
  *puVar9 = plVar8;
  puVar9[1] = 0;
  *(undefined1 *)plVar8 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_e8._M_dataplus._M_p._4_4_,local_e8._M_dataplus._M_p._0_4_) !=
      &local_e8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_e8._M_dataplus._M_p._4_4_,local_e8._M_dataplus._M_p._0_4_),
                    local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.sa_handler != local_190) {
    operator_delete(local_1a0.sa_handler,local_190[0]._M_allocated_capacity + 1);
  }
  if (local_c8.sa_handler != (__sighandler_t)&local_b8) {
    operator_delete(local_c8.sa_handler,local_b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0.field_2._M_allocated_capacity != &local_2c0) {
    operator_delete((void *)local_2e0.field_2._M_allocated_capacity,
                    local_2c0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300 + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,(ulong)(local_2e0._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,(ulong)(local_270.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  Arguments::Arguments((Arguments *)&local_1e8);
  __x = GetInjectableArgvs_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_1a0,__x);
  Arguments::AddArguments<std::__cxx11::string>
            ((Arguments *)&local_1e8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1a0);
  __position._M_current = (char **)(local_1e8._M_string_length - 8);
  local_1a0.sa_handler = (__sighandler_t)strdup((char *)local_210);
  std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
            ((vector<char_*,_std::allocator<char_*>_> *)&local_1e8,__position,
             (value_type *)&local_1a0.sa_handler);
  local_1a0.sa_handler = (__sighandler_t)strdup((char *)local_108);
  std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
            ((vector<char_*,_std::allocator<char_*>_> *)&local_1e8,
             (char **)(local_1e8._M_string_length - 8),(value_type *)&local_1a0.sa_handler);
  local_1a0.sa_handler = (__sighandler_t)local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"");
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.sa_handler != local_190) {
    operator_delete(local_1a0.sa_handler,local_190[0]._M_allocated_capacity + 1);
  }
  CaptureStderr();
  fflush((FILE *)0x0);
  psVar14 = (string *)(ulong)local_1f0;
  local_1c0._M_dataplus._M_p = local_1e8._M_dataplus._M_p;
  local_1c0._M_string_length._0_4_ = local_1f0;
  memset(&local_c8,0,0x98);
  sigemptyset((sigset_t *)local_c0);
  local_c8 = (_union_1457)0x1;
  do {
    while (iVar4 = sigaction(0x1b,(sigaction *)&local_c8,(sigaction *)&local_1a0), iVar4 == -1) {
      piVar10 = __errno_location();
      if (*piVar10 != 4) {
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_270,"CHECK failed: File ","");
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_270);
        local_250._M_dataplus._M_p = (pointer)*plVar8;
        puVar11 = (ulong *)(plVar8 + 2);
        if ((ulong *)local_250._M_dataplus._M_p == puVar11) {
          local_250.field_2._M_allocated_capacity = *puVar11;
          local_250.field_2._8_8_ = plVar8[3];
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        }
        else {
          local_250.field_2._M_allocated_capacity = *puVar11;
        }
        local_250._M_string_length = plVar8[1];
        *plVar8 = (long)puVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
        local_290._M_dataplus._M_p = (pointer)*puVar9;
        puVar11 = puVar9 + 2;
        if ((ulong *)local_290._M_dataplus._M_p == puVar11) {
          local_290.field_2._M_allocated_capacity = *puVar11;
          local_290.field_2._8_8_ = puVar9[3];
          local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        }
        else {
          local_290.field_2._M_allocated_capacity = *puVar11;
        }
        local_290._M_string_length = puVar9[1];
        *puVar9 = puVar11;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        local_e8._M_dataplus._M_p._0_4_ = 0x417;
        StreamableToString<int>(&local_230,(int *)&local_e8);
        uVar20 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          uVar20 = local_290.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar20 < local_230._M_string_length + local_290._M_string_length) {
          uVar20 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            uVar20 = local_230.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar20 < local_230._M_string_length + local_290._M_string_length)
          goto LAB_0011a714;
          plVar8 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_230,0,(char *)0x0,
                                      (ulong)local_290._M_dataplus._M_p);
        }
        else {
LAB_0011a714:
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_290,(ulong)local_230._M_dataplus._M_p);
        }
        local_2f0 = (string *)*plVar8;
        psVar14 = (string *)(plVar8 + 2);
        if (local_2f0 == psVar14) {
          local_2e0._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
          local_2e0._M_string_length = plVar8[3];
          local_2f0 = &local_2e0;
        }
        else {
          local_2e0._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
        }
        local_2e8 = plVar8[1];
        *plVar8 = (long)psVar14;
        plVar8[1] = 0;
        *(undefined1 *)&(psVar14->_M_dataplus)._M_p = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
        local_310 = (ulong *)*puVar9;
        puVar11 = puVar9 + 2;
        if (local_310 == puVar11) {
          local_300 = *puVar11;
          lStack_2f8 = puVar9[3];
          local_310 = &local_300;
        }
        else {
          local_300 = *puVar11;
        }
        local_308 = puVar9[1];
        *puVar9 = puVar11;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
        local_2e0.field_2._M_allocated_capacity = (size_type)&local_2c0;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9;
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if (paVar17 != paVar16) goto LAB_0011b453;
        local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_2c0._8_8_ = puVar9[3];
        goto LAB_0011b460;
      }
    }
    bVar3 = AlwaysTrue();
    cVar2 = FLAGS_gtest_death_test_use_fork;
  } while (!bVar3);
  iVar4 = -1;
  if (FLAGS_gtest_death_test_use_fork == '\0') {
    if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
      AssumeRole();
    }
    uVar5 = getpagesize();
    __len = (size_t)(int)uVar5;
    __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
LAB_00119bbb:
    bVar3 = IsTrue(__addr != (void *)0xffffffffffffffff);
    if (bVar3) goto code_r0x00119bd2;
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","");
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
    local_290._M_dataplus._M_p = (pointer)*puVar9;
    puVar11 = puVar9 + 2;
    if ((ulong *)local_290._M_dataplus._M_p == puVar11) {
      local_290.field_2._M_allocated_capacity = *puVar11;
      local_290.field_2._8_8_ = puVar9[3];
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    }
    else {
      local_290.field_2._M_allocated_capacity = *puVar11;
    }
    local_290._M_string_length = puVar9[1];
    *puVar9 = puVar11;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
    local_2f0 = (string *)*puVar9;
    psVar14 = (string *)(puVar9 + 2);
    if (local_2f0 == psVar14) {
      local_2e0._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
      local_2e0._M_string_length = puVar9[3];
      local_2f0 = &local_2e0;
    }
    else {
      local_2e0._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
    }
    local_2e8 = puVar9[1];
    *puVar9 = psVar14;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    local_230._M_dataplus._M_p._0_4_ = 0x423;
    StreamableToString<int>(&local_270,(int *)&local_230);
    _Var19._M_p = (pointer)0xf;
    if (local_2f0 != &local_2e0) {
      _Var19._M_p = local_2e0._M_dataplus._M_p;
    }
    if (_Var19._M_p < (pointer)(local_270._M_string_length + local_2e8)) {
      uVar20 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        uVar20 = local_270.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar20 < (pointer)(local_270._M_string_length + local_2e8)) goto LAB_0011a939;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0);
    }
    else {
LAB_0011a939:
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p)
      ;
    }
    local_310 = (ulong *)*puVar9;
    puVar11 = puVar9 + 2;
    if (local_310 == puVar11) {
      local_300 = *puVar11;
      lStack_2f8 = puVar9[3];
      local_310 = &local_300;
    }
    else {
      local_300 = *puVar11;
    }
    local_308 = puVar9[1];
    *puVar9 = puVar11;
    puVar9[1] = 0;
    *(undefined1 *)puVar11 = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
    local_2e0.field_2._M_allocated_capacity = *puVar9;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0.field_2._M_allocated_capacity == paVar16) {
      local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_2c0._8_8_ = puVar9[3];
      local_2e0.field_2._M_allocated_capacity = (size_type)&local_2c0;
    }
    else {
LAB_0011b2ff:
      local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_2e0.field_2._8_8_ = puVar9[1];
    *puVar9 = paVar16;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append(local_2e0.field_2._M_local_buf);
    local_2b0._M_dataplus._M_p = (pointer)*puVar9;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar16) {
      local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = puVar9[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_2b0._M_string_length = puVar9[1];
    *puVar9 = paVar16;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    DeathTestAbort(&local_2b0);
    puVar9 = extraout_RAX_02;
    local_2b0._M_dataplus._M_p = (pointer)extraout_RDX_02;
    goto LAB_0011b5b9;
  }
LAB_00119c67:
  if ((cVar2 == '\0') || (iVar4 = fork(), iVar4 != 0)) {
    do {
      while (iVar6 = sigaction(0x1b,(sigaction *)&local_1a0,(sigaction *)0x0), iVar6 == -1) {
        piVar10 = __errno_location();
        if (*piVar10 != 4) {
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_270,"CHECK failed: File ","");
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
          local_250._M_dataplus._M_p = (pointer)*puVar9;
          puVar11 = puVar9 + 2;
          if ((ulong *)local_250._M_dataplus._M_p == puVar11) {
            local_250.field_2._M_allocated_capacity = *puVar11;
            local_250.field_2._8_8_ = puVar9[3];
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          }
          else {
            local_250.field_2._M_allocated_capacity = *puVar11;
          }
          local_250._M_string_length = puVar9[1];
          *puVar9 = puVar11;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
          local_290._M_dataplus._M_p = (pointer)*puVar9;
          puVar11 = puVar9 + 2;
          if ((ulong *)local_290._M_dataplus._M_p == puVar11) {
            local_290.field_2._M_allocated_capacity = *puVar11;
            local_290.field_2._8_8_ = puVar9[3];
            local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
          }
          else {
            local_290.field_2._M_allocated_capacity = *puVar11;
          }
          local_290._M_string_length = puVar9[1];
          *puVar9 = puVar11;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          local_e8._M_dataplus._M_p._0_4_ = 0x441;
          StreamableToString<int>(&local_230,(int *)&local_e8);
          uVar20 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != &local_290.field_2) {
            uVar20 = local_290.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar20 < local_230._M_string_length + local_290._M_string_length) {
            uVar20 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              uVar20 = local_230.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar20 < local_230._M_string_length + local_290._M_string_length)
            goto LAB_0011a7da;
            plVar8 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_230,0,(char *)0x0,
                                        (ulong)local_290._M_dataplus._M_p);
          }
          else {
LAB_0011a7da:
            plVar8 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_290,(ulong)local_230._M_dataplus._M_p);
          }
          local_2f0 = (string *)*plVar8;
          psVar14 = (string *)(plVar8 + 2);
          if (local_2f0 == psVar14) {
            local_2e0._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
            local_2e0._M_string_length = plVar8[3];
            local_2f0 = &local_2e0;
          }
          else {
            local_2e0._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
          }
          local_2e8 = plVar8[1];
          *plVar8 = (long)psVar14;
          plVar8[1] = 0;
          *(undefined1 *)&(psVar14->_M_dataplus)._M_p = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
          local_310 = (ulong *)*puVar9;
          puVar11 = puVar9 + 2;
          if (local_310 == puVar11) {
            local_300 = *puVar11;
            lStack_2f8 = puVar9[3];
            local_310 = &local_300;
          }
          else {
            local_300 = *puVar11;
          }
          local_308 = puVar9[1];
          *puVar9 = puVar11;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
          local_2e0.field_2._M_allocated_capacity = *puVar9;
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0.field_2._M_allocated_capacity == paVar16) {
            local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_2c0._8_8_ = puVar9[3];
            local_2e0.field_2._M_allocated_capacity = (size_type)&local_2c0;
          }
          else {
            local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
          }
          local_2e0.field_2._8_8_ = puVar9[1];
          *puVar9 = paVar16;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append(local_2e0.field_2._M_local_buf);
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar9;
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if (paVar17 != paVar16) goto LAB_0011b643;
          local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_2b0.field_2._8_8_ = puVar9[3];
          goto LAB_0011b650;
        }
      }
      bVar3 = AlwaysTrue();
    } while (!bVar3);
    do {
      bVar3 = IsTrue(iVar4 != -1);
      if (!bVar3) {
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,"CHECK failed: File ","");
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_250);
        local_290._M_dataplus._M_p = (pointer)*plVar8;
        puVar11 = (ulong *)(plVar8 + 2);
        if ((ulong *)local_290._M_dataplus._M_p == puVar11) {
          local_290.field_2._M_allocated_capacity = *puVar11;
          local_290.field_2._8_8_ = plVar8[3];
          local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        }
        else {
          local_290.field_2._M_allocated_capacity = *puVar11;
        }
        local_290._M_string_length = plVar8[1];
        *plVar8 = (long)puVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
        local_2f0 = (string *)*puVar9;
        psVar14 = (string *)(puVar9 + 2);
        if (local_2f0 == psVar14) {
          local_2e0._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
          local_2e0._M_string_length = puVar9[3];
          local_2f0 = &local_2e0;
        }
        else {
          local_2e0._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
        }
        local_2e8 = puVar9[1];
        *puVar9 = psVar14;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        local_230._M_dataplus._M_p._0_4_ = 0x444;
        StreamableToString<int>(&local_270,(int *)&local_230);
        _Var19._M_p = (pointer)0xf;
        if (local_2f0 != &local_2e0) {
          _Var19._M_p = local_2e0._M_dataplus._M_p;
        }
        if (_Var19._M_p < (pointer)(local_270._M_string_length + local_2e8)) {
          uVar20 = (pointer)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            uVar20 = local_270.field_2._M_allocated_capacity;
          }
          psVar14 = local_2f0;
          if ((pointer)(local_270._M_string_length + local_2e8) <= (ulong)uVar20) goto LAB_0011abec;
        }
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
        goto LAB_0011abfd;
      }
      bVar3 = AlwaysTrue();
    } while (!bVar3);
    do {
      while (iVar6 = close(local_1ec), iVar6 != -1) {
        bVar3 = AlwaysTrue();
        if (bVar3) {
          *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = iVar4;
          (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_1f0;
          (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
          Arguments::~Arguments((Arguments *)&local_1e8);
          if (local_108 != &local_f8) {
            operator_delete(local_108,local_f8 + 1);
          }
          if (local_210 != &local_200) {
            operator_delete(local_210,local_200 + 1);
          }
          return OVERSEE_TEST;
        }
      }
      piVar10 = __errno_location();
    } while (*piVar10 == 4);
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"CHECK failed: File ","");
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
    local_2f0 = (string *)*puVar9;
    psVar14 = (string *)(puVar9 + 2);
    if (local_2f0 == psVar14) {
      local_2e0._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
      local_2e0._M_string_length = puVar9[3];
      local_2f0 = &local_2e0;
    }
    else {
      local_2e0._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
    }
    local_2e8 = puVar9[1];
    *puVar9 = psVar14;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    local_310 = (ulong *)*puVar9;
    puVar11 = puVar9 + 2;
    if (local_310 == puVar11) {
      local_300 = *puVar11;
      lStack_2f8 = puVar9[3];
      local_310 = &local_300;
    }
    else {
      local_300 = *puVar11;
    }
    local_308 = puVar9[1];
    *puVar9 = puVar11;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    local_270._M_dataplus._M_p._0_4_ = 0x473;
    StreamableToString<int>(&local_250,(int *)&local_270);
    uVar18 = 0xf;
    if (local_310 != &local_300) {
      uVar18 = local_300;
    }
    if (uVar18 < local_250._M_string_length + local_308) {
      uVar20 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        uVar20 = local_250.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar20 < local_250._M_string_length + local_308) goto LAB_0011a88b;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_310);
    }
    else {
LAB_0011a88b:
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_250._M_dataplus._M_p)
      ;
    }
    local_2e0.field_2._M_allocated_capacity = *puVar9;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0.field_2._M_allocated_capacity == paVar16) {
      local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_2c0._8_8_ = puVar9[3];
      local_2e0.field_2._M_allocated_capacity = (size_type)&local_2c0;
    }
    else {
      local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_2e0.field_2._8_8_ = puVar9[1];
    *puVar9 = paVar16;
    puVar9[1] = 0;
    paVar16->_M_local_buf[0] = '\0';
    plVar8 = (long *)std::__cxx11::string::append(local_2e0.field_2._M_local_buf);
    local_2b0._M_dataplus._M_p = (pointer)*plVar8;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar16) {
      local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = plVar8[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_2b0._M_string_length = plVar8[1];
    *plVar8 = (long)paVar16;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
    local_c8.sa_handler = (__sighandler_t)*puVar9;
    p_Var12 = (__sighandler_t)(puVar9 + 2);
    if (local_c8.sa_handler == p_Var12) {
      local_b8 = *(ulong *)p_Var12;
      uStack_b0 = puVar9[3];
      local_c8.sa_handler = (__sighandler_t)&local_b8;
    }
    else {
      local_b8 = *(ulong *)p_Var12;
    }
    local_c0 = (undefined1  [8])puVar9[1];
    *puVar9 = p_Var12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
    local_1a0.sa_handler = (__sighandler_t)*puVar9;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0.sa_handler == paVar16) {
      local_190[0]._0_8_ = paVar16->_M_allocated_capacity;
      local_190[0]._8_8_ = puVar9[3];
      local_1a0.sa_handler = (__sighandler_t)local_190;
      goto LAB_0011b684;
    }
  }
  else {
    ExecDeathTestChildMain(&local_1c0);
LAB_0011abec:
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)psVar14);
LAB_0011abfd:
    local_310 = (ulong *)*puVar9;
    puVar11 = puVar9 + 2;
    if (local_310 == puVar11) {
      local_300 = *puVar11;
      lStack_2f8 = puVar9[3];
      local_310 = &local_300;
    }
    else {
      local_300 = *puVar11;
    }
    local_308 = puVar9[1];
    *puVar9 = puVar11;
    puVar9[1] = 0;
    *(undefined1 *)puVar11 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_310);
    local_2e0.field_2._M_allocated_capacity = *plVar8;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0.field_2._M_allocated_capacity == paVar16) {
      local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_2c0._8_8_ = plVar8[3];
      local_2e0.field_2._M_allocated_capacity = (size_type)&local_2c0;
    }
    else {
      local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_2e0.field_2._8_8_ = plVar8[1];
    *plVar8 = (long)paVar16;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append(local_2e0.field_2._M_local_buf);
    local_2b0._M_dataplus._M_p = (pointer)*puVar9;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar16) {
      local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = puVar9[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_2b0._M_string_length = puVar9[1];
    *puVar9 = paVar16;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    DeathTestAbort(&local_2b0);
    puVar9 = extraout_RAX_01;
    paVar17 = extraout_RDX_01;
LAB_0011b453:
    local_2c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_2e0.field_2._M_allocated_capacity = (size_type)paVar17;
LAB_0011b460:
    local_2e0.field_2._8_8_ = puVar9[1];
    *puVar9 = paVar16;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append(local_2e0.field_2._M_local_buf);
    local_2b0._M_dataplus._M_p = (pointer)*puVar9;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar16) {
      local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = puVar9[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
LAB_0011b615:
      local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_2b0._M_string_length = puVar9[1];
    *puVar9 = paVar16;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    DeathTestAbort(&local_2b0);
    puVar9 = extraout_RAX_05;
    paVar17 = extraout_RDX_05;
LAB_0011b643:
    local_2b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_2b0._M_dataplus._M_p = (pointer)paVar17;
LAB_0011b650:
    local_2b0._M_string_length = puVar9[1];
    *puVar9 = paVar16;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    DeathTestAbort(&local_2b0);
    puVar9 = extraout_RAX_06;
    local_1a0 = extraout_RDX_06;
  }
  local_190[0]._0_8_ = paVar16->_M_allocated_capacity;
LAB_0011b684:
  local_198 = puVar9[1];
  *puVar9 = paVar16;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  DeathTestAbort((string *)&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.sa_handler != local_190) {
    operator_delete(local_1a0.sa_handler,local_190[0]._M_allocated_capacity + 1);
  }
  if (local_c8.sa_handler != (__sighandler_t)&local_b8) {
    operator_delete(local_c8.sa_handler,local_b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0.field_2._M_allocated_capacity != &local_2c0) {
    operator_delete((void *)local_2e0.field_2._M_allocated_capacity,
                    local_2c0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300 + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,(ulong)(local_2e0._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  Arguments::~Arguments((Arguments *)&local_1e8);
  if (local_108 != &local_f8) {
    operator_delete(local_108,local_f8 + 1);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  _Unwind_Resume(extraout_RAX_07);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != NULL) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kFilterFlag + "="
      + info->test_case_name() + "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}